

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_1::PosixMmapReadableFile::~PosixMmapReadableFile(PosixMmapReadableFile *this)

{
  PosixMmapReadableFile *this_local;
  
  (this->super_RandomAccessFile)._vptr_RandomAccessFile =
       (_func_int **)&PTR__PosixMmapReadableFile_0015fc60;
  munmap(this->mmapped_region_,this->length_);
  MmapLimiter::Release(this->limiter_);
  std::__cxx11::string::~string((string *)&this->filename_);
  RandomAccessFile::~RandomAccessFile(&this->super_RandomAccessFile);
  return;
}

Assistant:

virtual ~PosixMmapReadableFile() {
                munmap(mmapped_region_, length_);
                limiter_->Release();
            }